

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.h
# Opt level: O2

bool mocker::runOptPasses<mocker::SimplifyPhiFunctions>(Module *module)

{
  bool bVar1;
  __node_base *p_Var2;
  __node_base *p_Var3;
  
  p_Var2 = &(module->funcs)._M_h._M_before_begin;
  p_Var3 = p_Var2;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    ir::FunctionModule::buildContext((FunctionModule *)(p_Var3 + 5));
  }
  bVar1 = detail::runOptPassImpl<mocker::SimplifyPhiFunctions>(module,(FuncPass *)0x0);
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    ir::FunctionModule::buildContext((FunctionModule *)(p_Var2 + 5));
  }
  ir::verifyModule(module);
  return bVar1;
}

Assistant:

bool runOptPasses(ir::Module &module, Args &&... args) {
  for (auto &func : module.getFuncs())
    func.second.buildContext();
  auto res = detail::runOptPassImpl<Pass>(module, (Pass *)(nullptr),
                                          std::forward<Args>(args)...);
  for (auto &func : module.getFuncs())
    func.second.buildContext();
  ir::verifyModule(module);
  return res;
}